

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[4]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  void *__s1;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  uint *puVar9;
  uchar *in_RDX;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(params + 8) != 0) {
    lVar1 = *(long *)params;
    sVar7 = strlen((char *)in_RDX);
    s.size_ = sVar7;
    s.ptr = in_RDX;
    uVar4 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    lVar2 = *(long *)(params[6] + 6);
    uVar3 = *(ulong *)(params + 8);
    uVar10 = (ulong)((int)uVar3 - 1U & uVar4);
    uVar5 = *(uint *)(lVar2 + 4 + uVar10 * 8);
    if (uVar5 != 0) {
      puVar9 = (uint *)(lVar2 + uVar10 * 8);
      uVar12 = 0;
      do {
        if ((uVar5 != 1) && (*puVar9 == uVar4)) {
          uVar11 = (ulong)(uVar5 - 2);
          __s1 = *(void **)(lVar1 + uVar11 * 0x18);
          sVar7 = *(size_t *)(lVar1 + 8 + uVar11 * 0x18);
          sVar8 = strlen((char *)in_RDX);
          if ((sVar7 == sVar8 + 1) &&
             ((sVar7 == 0 || (iVar6 = bcmp(__s1,in_RDX,sVar7), iVar6 == 0)))) {
            uVar12 = uVar11 * 0x18 + *(long *)params;
            break;
          }
        }
        uVar11 = uVar10 + 1;
        uVar10 = uVar11 & 0xffffffff;
        if (uVar11 == uVar3) {
          uVar10 = uVar12;
        }
        puVar9 = (uint *)(lVar2 + uVar10 * 8);
        uVar5 = puVar9[1];
      } while (uVar5 != 0);
      goto LAB_001565df;
    }
  }
  uVar12 = 0;
LAB_001565df:
  *(ulong *)this = uVar12;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}